

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

uint8_t hex8_to_digest(char *data)

{
  uint8_t uVar1;
  uint8_t uVar2;
  char *data_local;
  
  uVar1 = hex4_to_digest(*data);
  uVar2 = hex4_to_digest(data[1]);
  return uVar1 * '\x10' + uVar2;
}

Assistant:

static uint8_t hex8_to_digest(const char data[2])
{
	return (hex4_to_digest(data[0]) * 16) + hex4_to_digest(data[1]);
}